

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O2

void __thiscall
glslang::TParseVersions::int16ScalarVectorCheck
          (TParseVersions *this,TSourceLoc *loc,char *op,bool builtIn)

{
  undefined7 in_register_00000009;
  char *extensions [4];
  
  if ((int)CONCAT71(in_register_00000009,builtIn) == 0) {
    extensions[2] = "GL_EXT_shader_explicit_arithmetic_types";
    extensions[3] = "GL_EXT_shader_explicit_arithmetic_types_int16";
    extensions[0]._0_4_ = 0x724b1b;
    extensions[0]._4_4_ = 0;
    extensions[1]._0_4_ = 0x702120;
    extensions[1]._4_4_ = 0;
    (*this->_vptr_TParseVersions[5])(this,loc,4,extensions,op);
  }
  return;
}

Assistant:

void TParseVersions::int16ScalarVectorCheck(const TSourceLoc& loc, const char* op, bool builtIn)
{
    if (! builtIn) {
    	const char* const extensions[] = {
                                           E_GL_AMD_gpu_shader_int16,
                                           E_GL_EXT_shader_16bit_storage,
                                           E_GL_EXT_shader_explicit_arithmetic_types,
                                           E_GL_EXT_shader_explicit_arithmetic_types_int16};
        requireExtensions(loc, sizeof(extensions)/sizeof(extensions[0]), extensions, op);
    }
}